

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O0

void __thiscall Mempool::Mempool(Mempool *this)

{
  Mempool *this_local;
  
  std::
  unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
  ::unordered_map(&this->mp_pool);
  this->mp_total_size_kb = 0;
  this->mp_left_size_kb = 0;
  std::mutex::mutex(&this->mp_mutex);
  mem_init(this,m4K,2000);
  mem_init(this,m16K,500);
  mem_init(this,m64K,0xfa);
  mem_init(this,m256K,100);
  mem_init(this,m1M,0x19);
  mem_init(this,m4M,10);
  this->mp_left_size_kb = this->mp_total_size_kb;
  return;
}

Assistant:

Mempool::Mempool() : mp_total_size_kb(0), mp_left_size_kb(0)
{
    mem_init(m4K, 2000);
    mem_init(m16K, 500);
    mem_init(m64K, 250);
    mem_init(m256K, 100);
    mem_init(m1M, 25);
    mem_init(m4M, 10);
    mp_left_size_kb = mp_total_size_kb;
}